

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::PausableReadAsyncIoStream::tryPumpFrom
          (PausableReadAsyncIoStream *this,AsyncInputStream *input,uint64_t amount)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  Maybe<kj::Promise<unsigned_long>_> MVar1;
  Maybe<kj::Promise<unsigned_long>_> result;
  AsyncOutputStream local_48;
  undefined1 local_40 [16];
  Deferred<kj::Function<void_()>_> local_30;
  
  (**(code **)(input[3]._vptr_AsyncInputStream[1] + 0x10))
            (local_40,input[3]._vptr_AsyncInputStream + 1);
  if (local_40[0] == true) {
    trackWrite(&local_30,(PausableReadAsyncIoStream *)input);
    Promise<unsigned_long>::attach<kj::_::Deferred<kj::Function<void()>>>
              ((Promise<unsigned_long> *)&local_48,
               (Deferred<kj::Function<void_()>_> *)(local_40 + 8));
    *(undefined1 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = 1;
    (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         local_48._vptr_AsyncOutputStream;
    local_48._vptr_AsyncOutputStream = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_48);
    kj::_::Deferred<kj::Function<void_()>_>::~Deferred(&local_30);
  }
  else {
    *(undefined1 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = 0;
  }
  kj::_::NullableValue<kj::Promise<unsigned_long>_>::~NullableValue
            ((NullableValue<kj::Promise<unsigned_long>_> *)local_40);
  MVar1.ptr.field_1 = extraout_RDX;
  MVar1.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> PausableReadAsyncIoStream::tryPumpFrom(
    kj::AsyncInputStream& input, uint64_t amount) {
  auto result = inner->tryPumpFrom(input, amount);
  KJ_IF_SOME(r, result) {
    return r.attach(trackWrite());
  } else {
    return kj::none;
  }
}